

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O2

ErrState * findErrorForCurrentThread(void)

{
  void *pvVar1;
  ErrState **ppEVar2;
  ErrState *pEVar3;
  
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformGrabMutex(errorLock);
  }
  if (errorStates != (ErrState *)0x0) {
    pvVar1 = __PHYSFS_platformGetThreadID();
    ppEVar2 = &errorStates;
    while (pEVar3 = *ppEVar2, pEVar3 != (ErrState *)0x0) {
      if (pEVar3->tid == pvVar1) goto LAB_001069ea;
      ppEVar2 = &pEVar3->next;
    }
  }
  pEVar3 = (ErrState *)0x0;
LAB_001069ea:
  if (errorLock != (void *)0x0) {
    __PHYSFS_platformReleaseMutex(errorLock);
  }
  return pEVar3;
}

Assistant:

static ErrState *findErrorForCurrentThread(void)
{
    ErrState *i;
    void *tid;

    if (errorLock != NULL)
        __PHYSFS_platformGrabMutex(errorLock);

    if (errorStates != NULL)
    {
        tid = __PHYSFS_platformGetThreadID();

        for (i = errorStates; i != NULL; i = i->next)
        {
            if (i->tid == tid)
            {
                if (errorLock != NULL)
                    __PHYSFS_platformReleaseMutex(errorLock);
                return i;
            } /* if */
        } /* for */
    } /* if */

    if (errorLock != NULL)
        __PHYSFS_platformReleaseMutex(errorLock);

    return NULL;   /* no error available. */
}